

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::parseEntity(QXmlStreamReaderPrivate *this,QString *value)

{
  unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *this_00;
  undefined1 *puVar1;
  QXmlStreamReaderPrivate *pQVar2;
  Data *__p;
  uint *puVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  QXmlStreamReader *q;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  q = this->q_ptr;
  if ((value->d).size != 0) {
    this_00 = &this->entityParser;
    pQVar2 = (this->entityParser)._M_t.
             super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
             .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
    if (pQVar2 == (QXmlStreamReaderPrivate *)0x0) {
      std::make_unique<QXmlStreamReaderPrivate,QXmlStreamReader*const&>
                ((QXmlStreamReader **)&local_48);
      __p = local_48.d;
      local_48.d = (Data *)0x0;
      std::__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      reset((__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             *)this_00,(pointer)__p);
      std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      ~unique_ptr((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                   *)&local_48);
    }
    else {
      init(pQVar2,(EVP_PKEY_CTX *)value);
    }
    puVar1 = &((this_00->_M_t).
               super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
               .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->field_0x3a8;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x80;
    QString::operator=(&((this_00->_M_t).
                         super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
                         .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->
                        readBuffer,value);
    puVar3 = QXmlStreamSimpleStack<unsigned_int>::push
                       (&((this_00->_M_t).
                          super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
                          .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->
                         putStack);
    *puVar3 = 0x2c0000;
    while( true ) {
      pQVar2 = (this_00->_M_t).
               super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
               .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
      if (pQVar2->atEnd != false) break;
      if (pQVar2->type == Invalid) goto LAB_0035343d;
      parse(pQVar2);
    }
    if ((pQVar2->type == Invalid) ||
       (*(qsizetype *)((long)&(pQVar2->super_QXmlStreamPrivateTagStack).tagStack + 8) != -1)) {
LAB_0035343d:
      QXmlStream::tr((QString *)&local_48,"Invalid entity value.",(char *)0x0,-1);
      raiseWellFormedError(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::parseEntity(const QString &value)
{
    Q_Q(QXmlStreamReader);

    if (value.isEmpty())
        return;


    if (!entityParser)
        entityParser = std::make_unique<QXmlStreamReaderPrivate>(q);
    else
        entityParser->init();
    entityParser->inParseEntity = true;
    entityParser->readBuffer = value;
    entityParser->injectToken(PARSE_ENTITY);
    while (!entityParser->atEnd && entityParser->type != QXmlStreamReader::Invalid)
        entityParser->parse();
    if (entityParser->type == QXmlStreamReader::Invalid || entityParser->tagStack.size())
        raiseWellFormedError(QXmlStream::tr("Invalid entity value."));

}